

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     Combine<duckdb::QuantileState<duckdb::timestamp_t,duckdb::QuantileStandardType>,duckdb::MedianAbsoluteDeviationOperation<duckdb::timestamp_t>>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  long lVar1;
  long lVar2;
  idx_t i;
  idx_t iVar3;
  
  lVar1 = *(long *)(source + 0x20);
  lVar2 = *(long *)(target + 0x20);
  for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
    QuantileOperation::
    Combine<duckdb::QuantileState<duckdb::timestamp_t,duckdb::QuantileStandardType>,duckdb::MedianAbsoluteDeviationOperation<duckdb::timestamp_t>>
              (*(QuantileState<duckdb::timestamp_t,_duckdb::QuantileStandardType> **)
                (lVar1 + iVar3 * 8),
               *(QuantileState<duckdb::timestamp_t,_duckdb::QuantileStandardType> **)
                (lVar2 + iVar3 * 8),aggr_input_data);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}